

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::SwapchainBuilder::SwapchainBuilder(SwapchainBuilder *this,Device *device,VkSurfaceKHR surface)

{
  bool bVar1;
  bool bVar2;
  uint *puVar3;
  undefined1 local_780 [8];
  Result<unsigned_int> graphics;
  Result<unsigned_int> present;
  undefined1 local_730 [8];
  Device temp_device;
  VkSurfaceKHR surface_local;
  Device *device_local;
  SwapchainBuilder *this_local;
  
  temp_device.internal_table.fp_vkDestroyDevice = (PFN_vkDestroyDevice)surface;
  SwapchainInfo::SwapchainInfo(&this->info);
  (this->info).physical_device = (device->physical_device).physical_device;
  (this->info).device = device->device;
  (this->info).surface = (VkSurfaceKHR)temp_device.internal_table.fp_vkDestroyDevice;
  (this->info).instance_version = device->instance_version;
  Device::Device((Device *)local_730,device);
  temp_device.physical_device._1720_8_ = temp_device.internal_table.fp_vkDestroyDevice;
  Device::get_queue_index((Result<unsigned_int> *)&graphics.m_init,(Device *)local_730,present);
  Device::get_queue_index((Result<unsigned_int> *)local_780,(Device *)local_730,graphics);
  bVar2 = Result<unsigned_int>::has_value((Result<unsigned_int> *)local_780);
  bVar1 = false;
  if (bVar2) {
    bVar2 = Result<unsigned_int>::has_value((Result<unsigned_int> *)&graphics.m_init);
    bVar1 = false;
    if (bVar2) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    puVar3 = Result<unsigned_int>::value((Result<unsigned_int> *)local_780);
    (this->info).graphics_queue_index = *puVar3;
    puVar3 = Result<unsigned_int>::value((Result<unsigned_int> *)&graphics.m_init);
    (this->info).present_queue_index = *puVar3;
    Result<unsigned_int>::~Result((Result<unsigned_int> *)local_780);
    Result<unsigned_int>::~Result((Result<unsigned_int> *)&graphics.m_init);
    Device::~Device((Device *)local_730);
    return;
  }
  __assert_fail("graphics.has_value() && present.has_value() && \"Graphics and Present queue indexes must be valid\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x757,"vkb::SwapchainBuilder::SwapchainBuilder(const Device &, const VkSurfaceKHR)"
               );
}

Assistant:

SwapchainBuilder::SwapchainBuilder(Device const& device, VkSurfaceKHR const surface) {
    info.physical_device = device.physical_device.physical_device;
    info.device = device.device;
    info.surface = surface;
    info.instance_version = device.instance_version;
    Device temp_device = device;
    temp_device.surface = surface;
    auto present = temp_device.get_queue_index(QueueType::present);
    auto graphics = temp_device.get_queue_index(QueueType::graphics);
    assert(graphics.has_value() && present.has_value() && "Graphics and Present queue indexes must be valid");
    info.graphics_queue_index = graphics.value();
    info.present_queue_index = present.value();
}